

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O0

void communicate(int connection,Arguments *args,int busy_waiting)

{
  int iVar1;
  void *__s;
  ssize_t sVar2;
  int *in_RSI;
  uint in_EDI;
  void *buffer;
  void *in_stack_ffffffffffffffd8;
  
  __s = malloc((long)*in_RSI);
  while( true ) {
    if (in_RSI[1] < 1) {
      cleanup((EVP_PKEY_CTX *)(ulong)in_EDI);
      return;
    }
    iVar1 = receive((int)__s,in_stack_ffffffffffffffd8,0,0x1023ab);
    if (iVar1 == -1) break;
    memset(__s,0x2a,(long)*in_RSI);
    sVar2 = send(in_EDI,__s,(long)*in_RSI,0);
    if (sVar2 == -1) {
      throw((char *)0x1023fd);
    }
    in_RSI[1] = in_RSI[1] + -1;
  }
  throw((char *)0x1023bc);
}

Assistant:

void communicate(int connection, struct Arguments* args, int busy_waiting) {
	void* buffer = malloc(args->size);

	for (; args->count > 0; --args->count) {
		if (receive(connection, buffer, args->size, busy_waiting) == -1) {
			throw("Error receiving on client-side");
		}

		// Dummy operation
		memset(buffer, '*', args->size);

		if (send(connection, buffer, args->size, 0) == -1) {
			throw("Error sending on client-side");
		}
	}

	cleanup(connection, buffer);
}